

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitor_UNIX.cpp
# Opt level: O0

bool __thiscall FIX::SocketMonitor::addRead(SocketMonitor *this,socket_handle s)

{
  bool bVar1;
  _Self local_30;
  _Self local_28;
  iterator i;
  socket_handle s_local;
  SocketMonitor *this_local;
  
  i._M_node._4_4_ = s;
  socket_setnonblock(s);
  local_28._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::find
                 (&this->m_readSockets,(key_type *)((long)&i._M_node + 4));
  local_30._M_node =
       (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(&this->m_readSockets);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (!bVar1) {
    std::set<int,_std::less<int>,_std::allocator<int>_>::insert
              (&this->m_readSockets,(value_type_conflict1 *)((long)&i._M_node + 4));
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool SocketMonitor::addRead(socket_handle s) {
  socket_setnonblock(s);
  Sockets::iterator i = m_readSockets.find(s);
  if (i != m_readSockets.end()) {
    return false;
  }

  m_readSockets.insert(s);
  return true;
}